

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

MeasurementSystem __thiscall QLocalePrivate::measurementSystem(QLocalePrivate *this)

{
  MeasurementSystem MVar1;
  TerritoryLanguage (*__range1) [5];
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  TerritoryLanguage ImperialMeasurementSystems [5];
  undefined8 uStack_40;
  undefined4 local_38;
  MeasurementSystem aMStack_34 [11];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _local_38 = 0x100f8004b;
  aMStack_34[1] = 0xf7004b;
  aMStack_34[2] = ImperialSystem;
  aMStack_34[3] = 0xf8010e;
  aMStack_34[4] = 1;
  aMStack_34[5] = 0xf80066;
  aMStack_34[6] = 1;
  MVar1 = 0xf6004b;
  aMStack_34[7] = 0xf6004b;
  aMStack_34[8] = ImperialUKSystem;
  lVar2 = 4;
  do {
    bVar3 = true;
    if ((*(quint16 *)((long)&uStack_40 + lVar2 + 4) == this->m_data->m_language_id) &&
       (*(quint16 *)((long)&uStack_40 + lVar2 + 6) == this->m_data->m_territory_id)) {
      MVar1 = *(MeasurementSystem *)((long)&local_38 + lVar2);
      bVar3 = false;
    }
    if (!bVar3) goto LAB_00315832;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x2c);
  MVar1 = MetricSystem;
LAB_00315832:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return MVar1;
  }
  uStack_40 = QLocale::weekdays;
  __stack_chk_fail();
}

Assistant:

QLocale::MeasurementSystem QLocalePrivate::measurementSystem() const
{
    /* Unicode CLDR's information about measurement systems doesn't say which to
       use by default in each locale. Even if it did, adding another entry in
       every locale's row of locale_data[] would take up much more memory than
       the small table below.
    */
    struct TerritoryLanguage
    {
        quint16 languageId;
        quint16 territoryId;
        QLocale::MeasurementSystem system;
    };
    // TODO: research how realistic and/or complete this is:
    constexpr TerritoryLanguage ImperialMeasurementSystems[] = {
        { QLocale::English, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::English, QLocale::UnitedStatesMinorOutlyingIslands, QLocale::ImperialUSSystem },
        { QLocale::Spanish, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::Hawaiian, QLocale::UnitedStates, QLocale::ImperialUSSystem },
        { QLocale::English, QLocale::UnitedKingdom, QLocale::ImperialUKSystem }
    };

    for (const auto &system : ImperialMeasurementSystems) {
        if (system.languageId == m_data->m_language_id
            && system.territoryId == m_data->m_territory_id) {
            return system.system;
        }
    }
    return QLocale::MetricSystem;
}